

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O1

void __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
::setFromSignUnbiasedExponentAndNormalizedSignificand
          (HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
           *this,bool negative,int_type exponent,uint_type significand,bool round_denorm_up)

{
  ushort uVar1;
  ulong uVar2;
  ushort uVar3;
  undefined6 in_register_0000000a;
  ushort uVar4;
  short sVar5;
  
  uVar2 = (ulong)((uint)(CONCAT62(in_register_0000000a,significand) >> 1) & 0x7fffffff | 0x200);
  if (-0xf < exponent) {
    uVar2 = CONCAT62(in_register_0000000a,significand) & 0xffffffff;
  }
  uVar1 = (ushort)uVar2;
  sVar5 = exponent;
  if (exponent < -0xf) {
    sVar5 = exponent + 0xf;
    do {
      uVar2 = (uVar2 & 0xffff) >> 1;
      uVar1 = (ushort)uVar2;
      sVar5 = sVar5 + 1;
    } while (sVar5 != 0);
    sVar5 = -0xf;
  }
  if ((short)(sVar5 + 0xfU) < 0) {
    __assert_fail("exponent >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/hex_float.h"
                  ,0x1c9,
                  "void spvtools::utils::HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>>::setFromSignUnbiasedExponentAndNormalizedSignificand(bool, int_type, uint_type, bool) [T = spvtools::utils::FloatProxy<spvtools::utils::Float16>, Traits = spvtools::utils::HexFloatTraits<FloatProxy<Float16>>]"
                 );
  }
  uVar4 = 1;
  if (!round_denorm_up) {
    uVar4 = uVar1;
  }
  if (sVar5 != -0xf || uVar1 != 0) {
    uVar4 = uVar1;
  }
  uVar3 = uVar4;
  if (significand == 0) {
    uVar3 = uVar1;
  }
  if (exponent < -0xe) {
    uVar3 = uVar4;
  }
  (this->value_).data_ = uVar3 & 0x3ff | (sVar5 + 0xfU & 0x1f) << 10 | (ushort)negative << 0xf;
  return;
}

Assistant:

void setFromSignUnbiasedExponentAndNormalizedSignificand(
      bool negative, int_type exponent, uint_type significand,
      bool round_denorm_up) {
    bool significand_is_zero = significand == 0;

    if (exponent <= min_exponent) {
      // If this was denormalized, then we have to shift the bit on, meaning
      // the significand is not zero.
      significand_is_zero = false;
      significand |= first_exponent_bit;
      significand = static_cast<uint_type>(significand >> 1);
    }

    while (exponent < min_exponent) {
      significand = static_cast<uint_type>(significand >> 1);
      ++exponent;
    }

    if (exponent == min_exponent) {
      if (significand == 0 && !significand_is_zero && round_denorm_up) {
        significand = static_cast<uint_type>(0x1);
      }
    }

    uint_type new_value = 0;
    if (negative) {
      new_value = static_cast<uint_type>(new_value | sign_mask);
    }
    exponent = static_cast<int_type>(exponent + exponent_bias);
    assert(exponent >= 0);

    // put it all together
    exponent = static_cast<uint_type>((exponent << exponent_left_shift) &
                                      exponent_mask);
    significand = static_cast<uint_type>(significand & fraction_encode_mask);
    new_value = static_cast<uint_type>(new_value | (exponent | significand));
    value_ = T(new_value);
  }